

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O0

bool idx2::IsRelative(stref *Path)

{
  stref *PathR;
  stref *Path_local;
  
  if (0 < Path->Size) {
    if (Path->Size < 1) {
      __assert_fail("Idx < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                    ,0x9b,"char &idx2::stref::operator[](int) const");
    }
    if (*(Path->field_0).Ptr == '/') {
      return false;
    }
  }
  if (2 < Path->Size) {
    if (Path->Size < 2) {
      __assert_fail("Idx < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                    ,0x9b,"char &idx2::stref::operator[](int) const");
    }
    if ((Path->field_0).Ptr[1] == ':') {
      if (Path->Size < 3) {
        __assert_fail("Idx < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/String.h"
                      ,0x9b,"char &idx2::stref::operator[](int) const");
      }
      if ((Path->field_0).Ptr[2] == '/') {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool
IsRelative(const stref& Path)
{
  stref& PathR = const_cast<stref&>(Path);
  if (PathR.Size > 0 && PathR[0] == '/') // e.g. /usr/local
    return false;
  if (PathR.Size > 2 && PathR[1] == ':' && PathR[2] == '/') // e.g. C:/Users
    return false;

  return true;
}